

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O2

void __thiscall InstructionGenerator::genDynamicGoto(InstructionGenerator *this)

{
  Instruction local_3c;
  undefined1 local_38 [48];
  
  local_3c = DYNAMIC_GOTO;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<Instruction>
            (this->bytecode,&local_3c);
  VirtualStack::pop((Variable *)local_38,&this->super_VirtualStack);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  return;
}

Assistant:

void InstructionGenerator::genDynamicGoto()
{
    bytecode->emplace_back(Instruction::DYNAMIC_GOTO);
    pop();
}